

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O1

void usage(int argc,char **argv)

{
  fprintf(_stderr,"Usage: %s [OPTIONS] FILE\n",*argv);
  fwrite("Inspect LRIT files.\n",0x14,1,_stderr);
  fputc(10,_stderr);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("  -x, --extract  Print data section of file\n",0x2c,1,_stderr);
  fwrite("  -j, --json     Print header in JSON format\n",0x2d,1,_stderr);
  fwrite("      --help     Show this help\n",0x20,1,_stderr);
  fputc(10,_stderr);
  exit(0);
}

Assistant:

void usage(int argc, char** argv) {
  fprintf(stderr, "Usage: %s [OPTIONS] FILE\n", argv[0]);
  fprintf(stderr, "Inspect LRIT files.\n");
  fprintf(stderr, "\n");
  fprintf(stderr, "Options:\n");
  fprintf(stderr, "  -x, --extract  Print data section of file\n");
  fprintf(stderr, "  -j, --json     Print header in JSON format\n");
  fprintf(stderr, "      --help     Show this help\n");
  fprintf(stderr, "\n");
  exit(0);
}